

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * google::protobuf::internal::PackedEnumParser
                 (void *object,char *ptr,ParseContext *ctx,_func_bool_int *is_valid,
                 InternalMetadataWithArenaLite *metadata,int field_num)

{
  char *pcVar1;
  uint64 val;
  bool bVar2;
  uint32 uVar3;
  uint uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  int iVar5;
  char *local_60;
  int local_54;
  uint32 local_50;
  int local_4c;
  InternalMetadataWithArenaLite *local_48;
  RepeatedField<int> *local_40;
  uint64 local_38;
  
  local_60 = ptr;
  local_50 = field_num;
  local_48 = metadata;
  local_40 = (RepeatedField<int> *)object;
  uVar3 = ReadSize(&local_60);
  if (local_60 != (char *)0x0) {
    pcVar1 = (ctx->super_EpsCopyInputStream).buffer_end_;
    uVar4 = uVar3 + ((int)local_60 - (int)pcVar1);
    (ctx->super_EpsCopyInputStream).limit_end_ = pcVar1 + (int)((int)uVar4 >> 0x1f & uVar4);
    local_54 = (ctx->super_EpsCopyInputStream).limit_;
    (ctx->super_EpsCopyInputStream).limit_ = uVar4;
    local_54 = local_54 - uVar4;
    if (-1 < local_54) {
      while (bVar2 = EpsCopyInputStream::DoneWithCheck(&ctx->super_EpsCopyInputStream,&local_60,-1),
            !bVar2) {
        local_60 = VarintParse<unsigned_long>(local_60,&local_38);
        val = local_38;
        if (local_60 == (char *)0x0) {
          return (char *)0x0;
        }
        iVar5 = (int)local_38;
        bVar2 = (*is_valid)(iVar5);
        if (bVar2) {
          local_4c = iVar5;
          RepeatedField<int>::Add(local_40,&local_4c);
        }
        else {
          if ((*(ulong *)local_48 & 1) == 0) {
            s = InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                ::mutable_unknown_fields_slow
                          ((InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                            *)local_48);
          }
          else {
            s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (*(ulong *)local_48 & 0xfffffffffffffffe);
          }
          WriteVarint(local_50,val,s);
        }
      }
      bVar2 = EpsCopyInputStream::PopLimit(&ctx->super_EpsCopyInputStream,local_54);
      if (bVar2) {
        return local_60;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char* PackedEnumParser(void* object, const char* ptr, ParseContext* ctx,
                             bool (*is_valid)(int),
                             InternalMetadataWithArenaLite* metadata,
                             int field_num) {
  return ctx->ReadPackedVarint(
      ptr, [object, is_valid, metadata, field_num](uint64 val) {
        if (is_valid(val)) {
          static_cast<RepeatedField<int>*>(object)->Add(val);
        } else {
          WriteVarint(field_num, val, metadata->mutable_unknown_fields());
        }
      });
}